

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

string * find_in_path(string *__return_storage_ptr__,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *paths,string *fname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  pointer pbVar7;
  bool bVar8;
  string path;
  string delimiter;
  ifstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  pointer local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  int aiStack_218 [122];
  
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_288 = fname;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/","");
  pbVar7 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_260 = (paths->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != local_260) {
    paVar1 = &__return_storage_ptr__->field_2;
    do {
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a8,pcVar2,pcVar2 + pbVar7->_M_string_length);
      if (local_2a8._M_string_length < local_280._M_string_length ||
          local_2a8._M_string_length - local_280._M_string_length == 0) {
        bVar8 = false;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((ulong)&local_2a8,local_2a8._M_string_length - local_280._M_string_length
                           ,(string *)local_280._M_string_length);
        bVar8 = iVar4 == 0;
      }
      if (bVar8) {
        std::operator+(__return_storage_ptr__,&local_2a8,local_288);
      }
      else {
        std::operator+(&local_258,&local_2a8,&local_280);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_258,(ulong)(local_288->_M_dataplus)._M_p);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar6) {
          lVar3 = plVar5[3];
          paVar1->_M_allocated_capacity = *psVar6;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
      }
      if ((!bVar8) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2)) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      std::ifstream::ifstream(local_238,(__return_storage_ptr__->_M_dataplus)._M_p,_S_in);
      iVar4 = *(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18));
      std::ifstream::~ifstream(local_238);
      if (iVar4 == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        goto LAB_00162bb7;
      }
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_260);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00162bb7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string find_in_path(vector<string> paths, string fname)
{
#ifdef _WIN32
  string delimiter = "\\";
#else
  string delimiter = "/";
#endif
  for (string path : paths)
  {
    string full = ends_with(path, delimiter) ? (path + fname) : (path + delimiter + fname);
    ifstream f(full.c_str());
    if (f.good())
      return full;
  }
  return "";
}